

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O2

SectionHdrWrapper * __thiscall PEFile::extendLastSection(PEFile *this,bufsize_t addedSize)

{
  bool bVar1;
  int iVar2;
  SectionHdrWrapper *pSVar3;
  undefined4 extraout_var;
  offset_t oVar4;
  bufsize_t bVar5;
  ulong uVar6;
  long lVar7;
  WatchedLocker lock;
  
  WatchedLocker::WatchedLocker(&lock,&this->m_peMutex,false,"extendLastSection");
  pSVar3 = _getLastSection(this);
  if (pSVar3 == (SectionHdrWrapper *)0x0) {
    bVar1 = false;
    lVar7 = 0;
  }
  else {
    iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[2])(this);
    oVar4 = SectionHdrWrapper::getContentOffset(pSVar3,RAW,false);
    lVar7 = CONCAT44(extraout_var,iVar2) + addedSize;
    if (oVar4 == 0xffffffffffffffff) {
      bVar1 = false;
    }
    else {
      uVar6 = lVar7 - oVar4;
      (*(pSVar3->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
        super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1d])(pSVar3,3,0xffffffffffffffff,uVar6);
      oVar4 = SectionHdrWrapper::getContentOffset(pSVar3,RVA,false);
      bVar5 = SectionHdrWrapper::getContentSize(pSVar3,RVA,false);
      bVar1 = true;
      if (bVar5 < uVar6) {
        (*(pSVar3->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
          super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1d])
                  (pSVar3,1,0xffffffffffffffff,uVar6);
        setVirtualSize(this,oVar4 + uVar6);
      }
    }
  }
  WatchedLocker::~WatchedLocker(&lock);
  if (bVar1) {
    (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer[10]
    )(this,lVar7);
    pSVar3 = getLastSection(this);
  }
  else {
    pSVar3 = (SectionHdrWrapper *)0x0;
  }
  return pSVar3;
}

Assistant:

SectionHdrWrapper* PEFile::extendLastSection(bufsize_t addedSize)
{
    bufsize_t newSize = 0;
    
    { //scope0
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        SectionHdrWrapper* secHdr = _getLastSection();
        if (!secHdr) return nullptr;

        //TODO: check overlay...
        const bufsize_t fullSize = getContentSize();
        newSize = fullSize + addedSize;

        const offset_t secROffset = secHdr->getContentOffset(Executable::RAW, false);
        if (secROffset == INVALID_ADDR) {
            return NULL;
        }
        const bufsize_t secNewRSize = newSize - secROffset; //include overlay in section
        secHdr->setNumValue(SectionHdrWrapper::RSIZE, uint64_t(secNewRSize));
        
        const offset_t secVOffset = secHdr->getContentOffset(Executable::RVA, false);
        const bufsize_t secVSize = secHdr->getContentSize(Executable::RVA, false);

        // if the previous virtual size is smaller than the new raw size, then update it:
        if (secVSize < secNewRSize) {
            secHdr->setNumValue(SectionHdrWrapper::VSIZE, uint64_t(secNewRSize));

            // if the virtual size of section has changed,
            // update the Size of Image (saved in the header):
            bufsize_t newVSize = secVOffset + secNewRSize;
            this->setVirtualSize(newVSize);
        }

    } //!scope0
    
    //update raw size:
    this->resize(newSize);
    //finally, retrieve the resized section:
    return getLastSection();
}